

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTests.cpp
# Opt level: O2

int __thiscall glcts::TextureBufferTests::init(TextureBufferTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TestNode *pTVar1;
  TextureBufferOperationsViaFrambufferReadBack *this_00;
  TextureBufferOperationsViaTransformFeedback *this_01;
  TextureBufferOperationsViaImageStore *this_02;
  TextureBufferOperationsViaSSBOWrites *this_03;
  TextureBufferMAXSizeValidation *this_04;
  TextureBufferTextureBufferRange *this_05;
  TextureBufferParamValueIntToFloatConversion *this_06;
  TextureBufferAtomicFunctions *this_07;
  TextureBufferParameters *this_08;
  TextureBufferErrors *this_09;
  TextureBufferActiveUniformValidationVSFS *this_10;
  TextureBufferActiveUniformValidationCS *this_11;
  TextureBufferBufferParameters *this_12;
  TextureBufferPrecision *this_13;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  pTVar1 = (TestNode *)operator_new(0x2f0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TextureBufferOperationsViaBufferObjectLoad::TextureBufferOperationsViaBufferObjectLoad
            ((TextureBufferOperationsViaBufferObjectLoad *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_operations_buffer_load","Test 1.1");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x2f0);
  TextureBufferOperationsViaCPUWrites::TextureBufferOperationsViaCPUWrites
            ((TextureBufferOperationsViaCPUWrites *)pTVar1,(this->super_TestCaseGroupBase).m_context
             ,extParams,"texture_buffer_operations_cpu_writes","Test 1.2");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (TextureBufferOperationsViaFrambufferReadBack *)operator_new(0x310);
  TextureBufferOperationsViaFrambufferReadBack::TextureBufferOperationsViaFrambufferReadBack
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_operations_framebuffer_readback","Test 1.3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TextureBufferOperationsViaTransformFeedback *)operator_new(0x308);
  TextureBufferOperationsViaTransformFeedback::TextureBufferOperationsViaTransformFeedback
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_operations_transform_feedback","Test 1.4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TextureBufferOperationsViaImageStore *)operator_new(0x2f8);
  TextureBufferOperationsViaImageStore::TextureBufferOperationsViaImageStore
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_operations_image_store","Test 1.5");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TextureBufferOperationsViaSSBOWrites *)operator_new(0x2f8);
  TextureBufferOperationsViaSSBOWrites::TextureBufferOperationsViaSSBOWrites
            (this_03,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_operations_ssbo_writes","Test 1.6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TextureBufferMAXSizeValidation *)operator_new(0x2c8);
  TextureBufferMAXSizeValidation::TextureBufferMAXSizeValidation
            (this_04,(this->super_TestCaseGroupBase).m_context,extParams,"texture_buffer_max_size",
             "Test 2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (TextureBufferTextureBufferRange *)operator_new(800);
  TextureBufferTextureBufferRange::TextureBufferTextureBufferRange
            (this_05,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_texture_buffer_range","Test 3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (TextureBufferParamValueIntToFloatConversion *)operator_new(0x2c8);
  TextureBufferParamValueIntToFloatConversion::TextureBufferParamValueIntToFloatConversion
            (this_06,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_conv_int_to_float","Test 4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (TextureBufferAtomicFunctions *)operator_new(0x2c8);
  TextureBufferAtomicFunctions::TextureBufferAtomicFunctions
            (this_07,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_atomic_functions","Test 5");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (TextureBufferParameters *)operator_new(0x2e8);
  TextureBufferParameters::TextureBufferParameters
            (this_08,(this->super_TestCaseGroupBase).m_context,extParams,"texture_buffer_parameters"
             ,"Test 6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (TextureBufferErrors *)operator_new(0x2d0);
  TextureBufferErrors::TextureBufferErrors
            (this_09,(this->super_TestCaseGroupBase).m_context,extParams,"texture_buffer_errors",
             "Test 7");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (TextureBufferActiveUniformValidationVSFS *)operator_new(0x2e8);
  TextureBufferActiveUniformValidationVSFS::TextureBufferActiveUniformValidationVSFS
            (this_10,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_active_uniform_validation_fragment_shader","Test 8.1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  this_11 = (TextureBufferActiveUniformValidationCS *)operator_new(0x2e8);
  TextureBufferActiveUniformValidationCS::TextureBufferActiveUniformValidationCS
            (this_11,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_active_uniform_validation_compute_shader","Test 8.2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
  this_12 = (TextureBufferBufferParameters *)operator_new(0x2c0);
  TextureBufferBufferParameters::TextureBufferBufferParameters
            (this_12,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_buffer_buffer_parameters","Test 9");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
  this_13 = (TextureBufferPrecision *)operator_new(0x2b8);
  TextureBufferPrecision::TextureBufferPrecision
            (this_13,(this->super_TestCaseGroupBase).m_context,extParams,"texture_buffer_precision",
             "Test 10");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  return extraout_EAX;
}

Assistant:

void TextureBufferTests::init(void)
{
	/* Initialize base class */
	TestCaseGroupBase::init();

	/* Texture Buffer Operations (Test 1) */

	/* Case 1 - via buffer object loads*/
	addChild(new TextureBufferOperationsViaBufferObjectLoad(m_context, m_extParams,
															"texture_buffer_operations_buffer_load", "Test 1.1"));
	/* Case 2 - via direct CPU writes*/
	addChild(new TextureBufferOperationsViaCPUWrites(m_context, m_extParams, "texture_buffer_operations_cpu_writes",
													 "Test 1.2"));
	/* Case 3 - via framebuffer readbacks to pixel buffer objects*/
	addChild(new TextureBufferOperationsViaFrambufferReadBack(
		m_context, m_extParams, "texture_buffer_operations_framebuffer_readback", "Test 1.3"));
	/* Case 4 - via transform feedback*/
	addChild(new TextureBufferOperationsViaTransformFeedback(
		m_context, m_extParams, "texture_buffer_operations_transform_feedback", "Test 1.4"));
	/* Case 5 - via image store*/
	addChild(new TextureBufferOperationsViaImageStore(m_context, m_extParams, "texture_buffer_operations_image_store",
													  "Test 1.5"));
	/* Case 6 - via ssbo writes*/
	addChild(new TextureBufferOperationsViaSSBOWrites(m_context, m_extParams, "texture_buffer_operations_ssbo_writes",
													  "Test 1.6"));

	/* Texture Buffer Max Size (Test 2)*/
	addChild(new TextureBufferMAXSizeValidation(m_context, m_extParams, "texture_buffer_max_size", "Test 2"));

	/* Texture Buffer Range (Test 3)*/
	addChild(
		new TextureBufferTextureBufferRange(m_context, m_extParams, "texture_buffer_texture_buffer_range", "Test 3"));

	/* Texture Buffer - Parameter Value from Integer To Float Conversion (Test 4)*/
	addChild(new TextureBufferParamValueIntToFloatConversion(m_context, m_extParams, "texture_buffer_conv_int_to_float",
															 "Test 4"));

	/* Texture Buffer Atomic Functions (Test 5) */
	addChild(new TextureBufferAtomicFunctions(m_context, m_extParams, "texture_buffer_atomic_functions", "Test 5"));

	/* Texture Buffer Parameters (Test 6) */
	addChild(new TextureBufferParameters(m_context, m_extParams, "texture_buffer_parameters", "Test 6"));

	/* Texture Buffer Errors (Test 7) */
	addChild(new TextureBufferErrors(m_context, m_extParams, "texture_buffer_errors", "Test 7"));

	/* Texture Buffer - Active Uniform Information Validation (Test 8)*/
	/* Vertex/Fragment Shader  */
	addChild(new TextureBufferActiveUniformValidationVSFS(
		m_context, m_extParams, "texture_buffer_active_uniform_validation_fragment_shader", "Test 8.1"));
	/* Compute Shader */
	addChild(new TextureBufferActiveUniformValidationCS(
		m_context, m_extParams, "texture_buffer_active_uniform_validation_compute_shader", "Test 8.2"));

	/* Texture Buffer Buffer Parameters (Test 9) */
	addChild(new TextureBufferBufferParameters(m_context, m_extParams, "texture_buffer_buffer_parameters", "Test 9"));

	/* Texture Buffer Precision (Test 10) */
	addChild(new TextureBufferPrecision(m_context, m_extParams, "texture_buffer_precision", "Test 10"));
}